

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O0

int CalculateBestCacheSize(uint32_t *argb,int quality,VP8LBackwardRefs *refs,int *best_cache_bits)

{
  PixOrCopy *p;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  VP8LHistogram *pVVar6;
  uint64_t uVar7;
  int *in_RCX;
  VP8LBackwardRefs *in_RDX;
  int in_ESI;
  uint *in_RDI;
  uint64_t entropy;
  int key_1;
  uint32_t argb_prev;
  int len;
  int extra_bits_value;
  int extra_bits;
  int code;
  int key;
  uint32_t b;
  uint32_t g;
  uint32_t r;
  uint32_t a;
  uint32_t pix;
  PixOrCopy *v;
  int ok;
  VP8LHistogram *histos [11];
  VP8LRefsCursor c;
  VP8LColorCache hashers [11];
  int cc_init [11];
  uint64_t entropy_min;
  int cache_bits_max;
  int i;
  int in_stack_fffffffffffffe28;
  int palette_code_bits;
  VP8LHistogram *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  uint32_t local_1c0;
  int in_stack_fffffffffffffe44;
  int local_1b4;
  uint32_t local_1b0;
  uint in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe64;
  int local_18c;
  long *local_188 [11];
  VP8LRefsCursor local_130;
  VP8LColorCache local_118 [11];
  int local_68 [12];
  uint64_t local_38;
  int local_30;
  int local_2c;
  int *local_28;
  VP8LBackwardRefs *local_20;
  uint *local_10;
  int local_4;
  
  if (in_ESI < 0x1a) {
    palette_code_bits = 0;
  }
  else {
    palette_code_bits = *in_RCX;
  }
  local_38 = 0xffffffffffffffff;
  local_30 = palette_code_bits;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  memset(local_68,0,0x2c);
  VP8LRefsCursorInit(&local_130,local_20);
  memset(local_188,0,0x58);
  local_18c = 0;
  if (local_30 == 0) {
    *local_28 = 0;
    local_4 = 1;
  }
  else {
    for (local_2c = 0; local_2c <= local_30; local_2c = local_2c + 1) {
      pVVar6 = VP8LAllocateHistogram(in_stack_fffffffffffffe3c);
      local_188[local_2c] = (long *)pVVar6;
      if (local_188[local_2c] == (long *)0x0) goto LAB_001c3885;
      VP8LHistogramInit(in_stack_fffffffffffffe30,palette_code_bits,in_stack_fffffffffffffe28);
      if (local_2c != 0) {
        iVar1 = VP8LColorCacheInit((VP8LColorCache *)
                                   CONCAT44(palette_code_bits,in_stack_fffffffffffffe28),0);
        local_68[local_2c] = iVar1;
        if (local_68[local_2c] == 0) goto LAB_001c3885;
      }
    }
    while (iVar1 = VP8LRefsCursorOk(&local_130), p = local_130.cur_pos, iVar1 != 0) {
      iVar1 = PixOrCopyIsLiteral(local_130.cur_pos);
      if (iVar1 == 0) {
        local_1c0 = PixOrCopyLength(p);
        uVar2 = *local_10 ^ 0xffffffff;
        VP8LPrefixEncode(in_stack_fffffffffffffe44,
                         (int *)(CONCAT44(*local_10,in_stack_fffffffffffffe38) ^ 0xffffffff00000000)
                         ,(int *)in_stack_fffffffffffffe30,
                         (int *)CONCAT44(palette_code_bits,in_stack_fffffffffffffe28));
        for (local_2c = 0; local_2c <= local_30; local_2c = local_2c + 1) {
          *(int *)(*local_188[local_2c] + (long)(local_1b4 + 0x100) * 4) =
               *(int *)(*local_188[local_2c] + (long)(local_1b4 + 0x100) * 4) + 1;
        }
        do {
          if (*local_10 != uVar2) {
            in_stack_fffffffffffffe38 = VP8LHashPix(*local_10,0x20 - local_30);
            for (local_2c = local_30; 0 < local_2c; local_2c = local_2c + -1) {
              local_118[local_2c].colors_[in_stack_fffffffffffffe38] = *local_10;
              in_stack_fffffffffffffe38 = in_stack_fffffffffffffe38 >> 1;
            }
            uVar2 = *local_10;
          }
          local_10 = local_10 + 1;
          local_1c0 = local_1c0 - 1;
        } while (local_1c0 != 0);
      }
      else {
        in_stack_fffffffffffffe64 = *local_10;
        in_stack_fffffffffffffe60 = in_stack_fffffffffffffe64 >> 0x18;
        uVar2 = in_stack_fffffffffffffe64 >> 0x10 & 0xff;
        uVar3 = in_stack_fffffffffffffe64 >> 8 & 0xff;
        uVar4 = in_stack_fffffffffffffe64 & 0xff;
        local_10 = local_10 + 1;
        local_1b0 = VP8LHashPix(in_stack_fffffffffffffe64,0x20 - local_30);
        *(int *)((long)local_188[0] + (ulong)uVar4 * 4 + 0x408) =
             *(int *)((long)local_188[0] + (ulong)uVar4 * 4 + 0x408) + 1;
        *(int *)(*local_188[0] + (ulong)uVar3 * 4) = *(int *)(*local_188[0] + (ulong)uVar3 * 4) + 1;
        *(int *)((long)local_188[0] + (ulong)uVar2 * 4 + 8) =
             *(int *)((long)local_188[0] + (ulong)uVar2 * 4 + 8) + 1;
        *(int *)((long)local_188[0] + (ulong)in_stack_fffffffffffffe60 * 4 + 0x808) =
             *(int *)((long)local_188[0] + (ulong)in_stack_fffffffffffffe60 * 4 + 0x808) + 1;
        for (local_2c = local_30; 0 < local_2c; local_2c = local_2c + -1) {
          uVar5 = VP8LColorCacheLookup(local_118 + local_2c,local_1b0);
          if (uVar5 == in_stack_fffffffffffffe64) {
            *(int *)(*local_188[local_2c] + (long)(int)(local_1b0 + 0x118) * 4) =
                 *(int *)(*local_188[local_2c] + (long)(int)(local_1b0 + 0x118) * 4) + 1;
          }
          else {
            VP8LColorCacheSet(local_118 + local_2c,local_1b0,in_stack_fffffffffffffe64);
            *(int *)((long)local_188[local_2c] + (ulong)uVar4 * 4 + 0x408) =
                 *(int *)((long)local_188[local_2c] + (ulong)uVar4 * 4 + 0x408) + 1;
            *(int *)(*local_188[local_2c] + (ulong)uVar3 * 4) =
                 *(int *)(*local_188[local_2c] + (ulong)uVar3 * 4) + 1;
            *(int *)((long)local_188[local_2c] + (ulong)uVar2 * 4 + 8) =
                 *(int *)((long)local_188[local_2c] + (ulong)uVar2 * 4 + 8) + 1;
            *(int *)((long)local_188[local_2c] + (ulong)in_stack_fffffffffffffe60 * 4 + 0x808) =
                 *(int *)((long)local_188[local_2c] + (ulong)in_stack_fffffffffffffe60 * 4 + 0x808)
                 + 1;
          }
          local_1b0 = (int)local_1b0 >> 1;
        }
      }
      VP8LRefsCursorNext((VP8LRefsCursor *)0x1c37fa);
    }
    for (local_2c = 0; local_2c <= local_30; local_2c = local_2c + 1) {
      uVar7 = VP8LHistogramEstimateBits
                        ((VP8LHistogram *)
                         CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
      if ((local_2c == 0) || (uVar7 < local_38)) {
        local_38 = uVar7;
        *local_28 = local_2c;
      }
    }
    local_18c = 1;
LAB_001c3885:
    for (local_2c = 0; local_2c <= local_30; local_2c = local_2c + 1) {
      if (local_68[local_2c] != 0) {
        VP8LColorCacheClear((VP8LColorCache *)0x1c38ce);
      }
      VP8LFreeHistogram((VP8LHistogram *)0x1c38e0);
    }
    local_4 = local_18c;
  }
  return local_4;
}

Assistant:

static int CalculateBestCacheSize(const uint32_t* argb, int quality,
                                  const VP8LBackwardRefs* const refs,
                                  int* const best_cache_bits) {
  int i;
  const int cache_bits_max = (quality <= 25) ? 0 : *best_cache_bits;
  uint64_t entropy_min = WEBP_UINT64_MAX;
  int cc_init[MAX_COLOR_CACHE_BITS + 1] = { 0 };
  VP8LColorCache hashers[MAX_COLOR_CACHE_BITS + 1];
  VP8LRefsCursor c = VP8LRefsCursorInit(refs);
  VP8LHistogram* histos[MAX_COLOR_CACHE_BITS + 1] = { NULL };
  int ok = 0;

  assert(cache_bits_max >= 0 && cache_bits_max <= MAX_COLOR_CACHE_BITS);

  if (cache_bits_max == 0) {
    *best_cache_bits = 0;
    // Local color cache is disabled.
    return 1;
  }

  // Allocate data.
  for (i = 0; i <= cache_bits_max; ++i) {
    histos[i] = VP8LAllocateHistogram(i);
    if (histos[i] == NULL) goto Error;
    VP8LHistogramInit(histos[i], i, /*init_arrays=*/ 1);
    if (i == 0) continue;
    cc_init[i] = VP8LColorCacheInit(&hashers[i], i);
    if (!cc_init[i]) goto Error;
  }

  // Find the cache_bits giving the lowest entropy. The search is done in a
  // brute-force way as the function (entropy w.r.t cache_bits) can be
  // anything in practice.
  while (VP8LRefsCursorOk(&c)) {
    const PixOrCopy* const v = c.cur_pos;
    if (PixOrCopyIsLiteral(v)) {
      const uint32_t pix = *argb++;
      const uint32_t a = (pix >> 24) & 0xff;
      const uint32_t r = (pix >> 16) & 0xff;
      const uint32_t g = (pix >>  8) & 0xff;
      const uint32_t b = (pix >>  0) & 0xff;
      // The keys of the caches can be derived from the longest one.
      int key = VP8LHashPix(pix, 32 - cache_bits_max);
      // Do not use the color cache for cache_bits = 0.
      ++histos[0]->blue_[b];
      ++histos[0]->literal_[g];
      ++histos[0]->red_[r];
      ++histos[0]->alpha_[a];
      // Deal with cache_bits > 0.
      for (i = cache_bits_max; i >= 1; --i, key >>= 1) {
        if (VP8LColorCacheLookup(&hashers[i], key) == pix) {
          ++histos[i]->literal_[NUM_LITERAL_CODES + NUM_LENGTH_CODES + key];
        } else {
          VP8LColorCacheSet(&hashers[i], key, pix);
          ++histos[i]->blue_[b];
          ++histos[i]->literal_[g];
          ++histos[i]->red_[r];
          ++histos[i]->alpha_[a];
        }
      }
    } else {
      int code, extra_bits, extra_bits_value;
      // We should compute the contribution of the (distance,length)
      // histograms but those are the same independently from the cache size.
      // As those constant contributions are in the end added to the other
      // histogram contributions, we can ignore them, except for the length
      // prefix that is part of the literal_ histogram.
      int len = PixOrCopyLength(v);
      uint32_t argb_prev = *argb ^ 0xffffffffu;
      VP8LPrefixEncode(len, &code, &extra_bits, &extra_bits_value);
      for (i = 0; i <= cache_bits_max; ++i) {
        ++histos[i]->literal_[NUM_LITERAL_CODES + code];
      }
      // Update the color caches.
      do {
        if (*argb != argb_prev) {
          // Efficiency: insert only if the color changes.
          int key = VP8LHashPix(*argb, 32 - cache_bits_max);
          for (i = cache_bits_max; i >= 1; --i, key >>= 1) {
            hashers[i].colors_[key] = *argb;
          }
          argb_prev = *argb;
        }
        argb++;
      } while (--len != 0);
    }
    VP8LRefsCursorNext(&c);
  }

  for (i = 0; i <= cache_bits_max; ++i) {
    const uint64_t entropy = VP8LHistogramEstimateBits(histos[i]);
    if (i == 0 || entropy < entropy_min) {
      entropy_min = entropy;
      *best_cache_bits = i;
    }
  }
  ok = 1;
 Error:
  for (i = 0; i <= cache_bits_max; ++i) {
    if (cc_init[i]) VP8LColorCacheClear(&hashers[i]);
    VP8LFreeHistogram(histos[i]);
  }
  return ok;
}